

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void BrotliEncoderInitState(BrotliEncoderState *s)

{
  BrotliEncoderState *s_local;
  
  BrotliEncoderInitParams(&s->params);
  s->input_pos_ = 0;
  s->num_commands_ = 0;
  s->num_literals_ = 0;
  s->last_insert_len_ = 0;
  s->last_flush_pos_ = 0;
  s->last_processed_pos_ = 0;
  s->prev_byte_ = '\0';
  s->prev_byte2_ = '\0';
  s->storage_size_ = 0;
  s->storage_ = (uint8_t *)0x0;
  (s->hasher_).common.extra = (void *)0x0;
  s->large_table_ = (int *)0x0;
  s->large_table_size_ = 0;
  s->cmd_code_numbits_ = 0;
  s->command_buf_ = (uint32_t *)0x0;
  s->literal_buf_ = (uint8_t *)0x0;
  s->next_out_ = (uint8_t *)0x0;
  s->available_out_ = 0;
  s->total_out_ = 0;
  s->stream_state_ = BROTLI_STREAM_PROCESSING;
  s->is_last_block_emitted_ = 0;
  s->is_initialized_ = 0;
  (s->ringbuffer_).cur_size_ = 0;
  (s->ringbuffer_).pos_ = 0;
  (s->ringbuffer_).data_ = (uint8_t *)0x0;
  (s->ringbuffer_).buffer_ = (uint8_t *)0x0;
  s->commands_ = (Command_conflict *)0x0;
  s->cmd_alloc_size_ = 0;
  s->dist_cache_[0] = 4;
  s->dist_cache_[1] = 0xb;
  s->dist_cache_[2] = 0xf;
  s->dist_cache_[3] = 0x10;
  *(undefined8 *)s->saved_dist_cache_ = *(undefined8 *)s->dist_cache_;
  *(undefined8 *)(s->saved_dist_cache_ + 2) = *(undefined8 *)(s->dist_cache_ + 2);
  return;
}

Assistant:

static void BrotliEncoderInitState(BrotliEncoderState* s) {
  BrotliEncoderInitParams(&s->params);
  s->input_pos_ = 0;
  s->num_commands_ = 0;
  s->num_literals_ = 0;
  s->last_insert_len_ = 0;
  s->last_flush_pos_ = 0;
  s->last_processed_pos_ = 0;
  s->prev_byte_ = 0;
  s->prev_byte2_ = 0;
  s->storage_size_ = 0;
  s->storage_ = 0;
  HasherInit(&s->hasher_);
  s->large_table_ = NULL;
  s->large_table_size_ = 0;
  s->cmd_code_numbits_ = 0;
  s->command_buf_ = NULL;
  s->literal_buf_ = NULL;
  s->next_out_ = NULL;
  s->available_out_ = 0;
  s->total_out_ = 0;
  s->stream_state_ = BROTLI_STREAM_PROCESSING;
  s->is_last_block_emitted_ = BROTLI_FALSE;
  s->is_initialized_ = BROTLI_FALSE;

  RingBufferInit(&s->ringbuffer_);

  s->commands_ = 0;
  s->cmd_alloc_size_ = 0;

  /* Initialize distance cache. */
  s->dist_cache_[0] = 4;
  s->dist_cache_[1] = 11;
  s->dist_cache_[2] = 15;
  s->dist_cache_[3] = 16;
  /* Save the state of the distance cache in case we need to restore it for
     emitting an uncompressed block. */
  memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->saved_dist_cache_));
}